

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestIteratorTestindexes::runTestCase(TestIteratorTestindexes *this)

{
  CommentInfo *pCVar1;
  TestResult *pTVar2;
  bool bVar3;
  Value *pVVar4;
  char *pcVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar6;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  string *psVar7;
  ValueIterator it;
  Value json;
  undefined1 auStack_188 [16];
  undefined1 local_178 [48];
  undefined1 local_148 [16];
  Value local_138;
  Value local_110;
  Value local_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  Json::Value::Value(&local_138,nullValue);
  Json::Value::Value(&local_48,"a");
  pVVar4 = Json::Value::operator[](&local_138,0);
  Json::Value::operator=(pVVar4,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_70,"b");
  pVVar4 = Json::Value::operator[](&local_138,1);
  Json::Value::operator=(pVVar4,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::begin((Value *)auStack_188);
  Json::Value::end((Value *)(auStack_188 + 0x10));
  bVar3 = Json::ValueIteratorBase::isEqual
                    ((ValueIteratorBase *)auStack_188,(SelfType *)(auStack_188 + 0x10));
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_IteratorTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x939,"it != json.end()");
  }
  pTVar2 = (this->super_IteratorTest).super_TestCase.result_;
  Json::Value::Value(&local_98,0);
  Json::ValueIteratorBase::key(&local_c0,(ValueIteratorBase *)auStack_188);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar2,&local_98,&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x93a,"Json::Value(Json::ArrayIndex(0)) == it.key()");
  Json::Value::~Value(&local_c0);
  Json::Value::~Value(&local_98);
  pTVar2 = (this->super_IteratorTest).super_TestCase.result_;
  pCVar1 = (CommentInfo *)(auStack_188 + 0x20);
  local_178._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_188 + 0x10),"");
  Json::ValueIteratorBase::name_abi_cxx11_
            ((string *)(local_178 + 0x20),(ValueIteratorBase *)auStack_188);
  psVar7 = (string *)(auStack_188 + 0x10);
  JsonTest::checkStringEqual
            (pTVar2,psVar7,(string *)(local_178 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x93b,"\"\" == it.name()");
  iVar6 = extraout_EDX;
  if ((undefined1 *)local_178._32_8_ != local_148) {
    operator_delete((void *)local_178._32_8_);
    iVar6 = extraout_EDX_00;
  }
  if ((CommentInfo *)local_178._0_8_ != pCVar1) {
    operator_delete((void *)local_178._0_8_);
    iVar6 = extraout_EDX_01;
  }
  pTVar2 = (this->super_IteratorTest).super_TestCase.result_;
  pcVar5 = Json::ValueIteratorBase::index((ValueIteratorBase *)auStack_188,(char *)psVar7,iVar6);
  JsonTest::checkEqual<int,unsigned_int>
            (pTVar2,0,(uint)pcVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x93c,"0 == it.index()");
  Json::ValueIteratorBase::increment((ValueIteratorBase *)auStack_188);
  Json::Value::end((Value *)(auStack_188 + 0x10));
  bVar3 = Json::ValueIteratorBase::isEqual
                    ((ValueIteratorBase *)auStack_188,(SelfType *)(auStack_188 + 0x10));
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_IteratorTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x93e,"it != json.end()");
  }
  pTVar2 = (this->super_IteratorTest).super_TestCase.result_;
  Json::Value::Value(&local_e8,1);
  Json::ValueIteratorBase::key(&local_110,(ValueIteratorBase *)auStack_188);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar2,&local_e8,&local_110,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x93f,"Json::Value(Json::ArrayIndex(1)) == it.key()");
  Json::Value::~Value(&local_110);
  Json::Value::~Value(&local_e8);
  pTVar2 = (this->super_IteratorTest).super_TestCase.result_;
  local_178._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_188 + 0x10),"");
  Json::ValueIteratorBase::name_abi_cxx11_
            ((string *)(local_178 + 0x20),(ValueIteratorBase *)auStack_188);
  psVar7 = (string *)(auStack_188 + 0x10);
  JsonTest::checkStringEqual
            (pTVar2,psVar7,(string *)(local_178 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x940,"\"\" == it.name()");
  iVar6 = extraout_EDX_02;
  if ((undefined1 *)local_178._32_8_ != local_148) {
    operator_delete((void *)local_178._32_8_);
    iVar6 = extraout_EDX_03;
  }
  if ((CommentInfo *)local_178._0_8_ != pCVar1) {
    operator_delete((void *)local_178._0_8_);
    iVar6 = extraout_EDX_04;
  }
  pTVar2 = (this->super_IteratorTest).super_TestCase.result_;
  pcVar5 = Json::ValueIteratorBase::index((ValueIteratorBase *)auStack_188,(char *)psVar7,iVar6);
  JsonTest::checkEqual<int,unsigned_int>
            (pTVar2,1,(uint)pcVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x941,"1 == it.index()");
  Json::ValueIteratorBase::increment((ValueIteratorBase *)auStack_188);
  Json::Value::end((Value *)(auStack_188 + 0x10));
  bVar3 = Json::ValueIteratorBase::isEqual
                    ((ValueIteratorBase *)auStack_188,(SelfType *)(auStack_188 + 0x10));
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_IteratorTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x943,"it == json.end()");
  }
  Json::Value::~Value(&local_138);
  return;
}

Assistant:

JSONTEST_FIXTURE(IteratorTest, indexes) {
  Json::Value json;
  json[0] = "a";
  json[1] = "b";
  Json::ValueIterator it = json.begin();
  JSONTEST_ASSERT(it != json.end());
  JSONTEST_ASSERT_EQUAL(Json::Value(Json::ArrayIndex(0)), it.key());
  JSONTEST_ASSERT_STRING_EQUAL("", it.name());
  JSONTEST_ASSERT_EQUAL(0, it.index());
  ++it;
  JSONTEST_ASSERT(it != json.end());
  JSONTEST_ASSERT_EQUAL(Json::Value(Json::ArrayIndex(1)), it.key());
  JSONTEST_ASSERT_STRING_EQUAL("", it.name());
  JSONTEST_ASSERT_EQUAL(1, it.index());
  ++it;
  JSONTEST_ASSERT(it == json.end());
}